

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O0

void __thiscall icu_63::Transliterator::Transliterator(Transliterator *this,Transliterator *other)

{
  int32_t iVar1;
  int iVar2;
  undefined4 extraout_var;
  __off_t __length;
  Transliterator *other_local;
  Transliterator *this_local;
  
  UObject::UObject(&this->super_UObject,&other->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Transliterator_005b9120;
  icu_63::UnicodeString::UnicodeString(&this->ID,&other->ID);
  this->filter = (UnicodeFilter *)0x0;
  this->maximumContextLength = other->maximumContextLength;
  icu_63::UnicodeString::append(&this->ID,L'\0');
  iVar1 = icu_63::UnicodeString::length(&this->ID);
  icu_63::UnicodeString::truncate(&this->ID,(char *)(ulong)(iVar1 - 1),__length);
  if (other->filter != (UnicodeFilter *)0x0) {
    iVar2 = (*(other->filter->super_UnicodeFunctor).super_UObject._vptr_UObject[3])();
    this->filter = (UnicodeFilter *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

Transliterator::Transliterator(const Transliterator& other) :
    UObject(other), ID(other.ID), filter(0),
    maximumContextLength(other.maximumContextLength)
{
    // NUL-terminate the ID string, which is a non-aliased copy.
    ID.append((UChar)0);
    ID.truncate(ID.length()-1);

    if (other.filter != 0) {
        // We own the filter, so we must have our own copy
        filter = (UnicodeFilter*) other.filter->clone();
    }
}